

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IfConversion::HoistInstruction
          (IfConversion *this,Instruction *inst,BasicBlock *target_block,
          DominatorAnalysis *dominators)

{
  bool bVar1;
  BasicBlock *a;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  Instruction *this_00;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  a = IRContext::get_instr_block((this->super_Pass).context_,inst);
  if (a != (BasicBlock *)0x0) {
    bVar1 = DominatorAnalysisBase::Dominates
                      (&dominators->super_DominatorAnalysisBase,a,target_block);
    if (!bVar1) {
      bVar1 = Instruction::IsOpcodeCodeMotionSafe(inst);
      if (!bVar1) {
        __assert_fail("inst->IsOpcodeCodeMotionSafe() && \"Trying to move an instruction that is not safe to move.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp"
                      ,0xfa,
                      "void spvtools::opt::IfConversion::HoistInstruction(Instruction *, BasicBlock *, DominatorAnalysis *)"
                     );
      }
      pDVar2 = IRContext::get_def_use_mgr((this->super_Pass).context_);
      local_50._8_8_ = 0;
      local_50._M_unused._M_object = operator_new(0x20);
      *(IfConversion **)local_50._M_unused._0_8_ = this;
      *(BasicBlock **)((long)local_50._M_unused._0_8_ + 8) = target_block;
      *(DefUseManager **)((long)local_50._M_unused._0_8_ + 0x10) = pDVar2;
      *(DominatorAnalysis **)((long)local_50._M_unused._0_8_ + 0x18) = dominators;
      local_38 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:255:7)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/if_conversion.cpp:255:7)>
                 ::_M_manager;
      Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      pIVar3 = BasicBlock::terminator(target_block);
      this_00 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      pIVar4 = (Instruction *)0x0;
      if ((this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false) {
        pIVar4 = this_00;
      }
      if (pIVar4->opcode_ != OpSelectionMerge) {
        this_00 = pIVar3;
      }
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                (&inst->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      local_50._M_unused._M_object = inst;
      Instruction::InsertBefore
                (this_00,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          *)&local_50);
      if ((Instruction *)local_50._M_unused._0_8_ != (Instruction *)0x0) {
        (**(code **)(*local_50._M_unused._M_object + 8))();
      }
      IRContext::set_instr_block((this->super_Pass).context_,inst,target_block);
    }
  }
  return;
}

Assistant:

void IfConversion::HoistInstruction(Instruction* inst, BasicBlock* target_block,
                                    DominatorAnalysis* dominators) {
  BasicBlock* inst_block = context()->get_instr_block(inst);
  if (!inst_block) {
    // This is in the header, and dominates everything.
    return;
  }

  if (dominators->Dominates(inst_block, target_block)) {
    // Already in position.  No work to do.
    return;
  }

  assert(inst->IsOpcodeCodeMotionSafe() &&
         "Trying to move an instruction that is not safe to move.");

  // First hoist all instructions it depends on.
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  inst->ForEachInId(
      [this, target_block, def_use_mgr, dominators](uint32_t* id) {
        Instruction* operand_inst = def_use_mgr->GetDef(*id);
        HoistInstruction(operand_inst, target_block, dominators);
      });

  Instruction* insertion_pos = target_block->terminator();
  if ((insertion_pos)->PreviousNode()->opcode() == spv::Op::OpSelectionMerge) {
    insertion_pos = insertion_pos->PreviousNode();
  }
  inst->RemoveFromList();
  insertion_pos->InsertBefore(std::unique_ptr<Instruction>(inst));
  context()->set_instr_block(inst, target_block);
}